

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::EnsureLdFldInlineeCodeGenRuntimeData
          (FunctionBody *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionBody *inlinee)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar5;
  Recycler *pRVar6;
  FunctionCodeGenRuntimeData **ptr;
  FunctionCodeGenRuntimeData *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  Type inlineeData;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa3,"(recycler)","recycler");
    if (!bVar2) goto LAB_006d4ed6;
    *puVar4 = 0;
  }
  uVar3 = GetInlineCacheCount(this);
  if (uVar3 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa4,"(inlineCacheIndex < this->GetInlineCacheCount())",
                                "inlineCacheIndex < this->GetInlineCacheCount()");
    if (!bVar2) goto LAB_006d4ed6;
    *puVar4 = 0;
  }
  if (inlinee == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa5,"(inlinee)","inlinee");
    if (!bVar2) {
LAB_006d4ed6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pWVar5 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar5 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    uVar3 = GetInlineCacheCount(this);
    data.plusSize = (size_t)uVar3;
    local_60 = (undefined1  [8])&FunctionCodeGenRuntimeData*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1aa9;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    uVar3 = GetInlineCacheCount(this);
    ptr = Memory::AllocateArray<Memory::Recycler,Js::FunctionCodeGenRuntimeData*,false>
                    ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar3);
    FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Js::FunctionCodeGenRuntimeData**>
              ((FunctionProxy *)this,ptr);
  }
  pWVar5 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  pWVar5 = pWVar5 + inlineCacheIndex;
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
            ((WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&data.line,pWVar5);
  if (data._32_8_ == 0) {
    local_60 = (undefined1  [8])&FunctionCodeGenRuntimeData::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1ab4;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    this_00 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar6,0x37a1d4);
    FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData(this_00,inlinee);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierSet(pWVar5,this_00);
    data._32_8_ = pWVar5->ptr;
  }
  return (FunctionCodeGenRuntimeData *)data._32_8_;
}

Assistant:

FunctionCodeGenRuntimeData *FunctionBody::EnsureLdFldInlineeCodeGenRuntimeData(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(inlineCacheIndex < this->GetInlineCacheCount());
        Assert(inlinee);

        if (this->GetCodeGenGetSetRuntimeData() == nullptr)
        {
            const auto codeGenRuntimeData = RecyclerNewArrayZ(recycler, FunctionCodeGenRuntimeData *, this->GetInlineCacheCount());
            this->SetCodeGenGetSetRuntimeData(codeGenRuntimeData);
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        const auto inlineeData = codeGenGetSetRuntimeData[inlineCacheIndex];
        if (inlineeData)
        {
            return inlineeData;
        }

        return codeGenGetSetRuntimeData[inlineCacheIndex] = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
    }